

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  type_info_t *ptVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  atomic<long> aVar4;
  atomic<long> aVar5;
  type_conflict tVar6;
  char **ppcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *this;
  ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *this_00;
  long *plVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  size_t maxSize;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  type_conflict tVar21;
  __atomic_base<long> _Var22;
  char *tmp_finish;
  __atomic_base<long> _Var23;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  undefined1 local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined8 local_d8;
  char *local_d0;
  char *local_c8;
  double local_c0;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_a8;
  ulong local_98;
  undefined8 local_90;
  long local_88;
  char *local_80 [2];
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  size_t local_50;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_48;
  
  if (argc < 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar20 = *argv;
    if (pcVar20 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x110200);
    }
    else {
      sVar11 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar20,sVar11);
    }
    pcVar20 = " <lru|scalable> <threads> <cache-size> <demand-size> [<duration>]\n";
    lVar15 = 0x42;
LAB_00107b3e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar20,lVar15);
    iVar9 = 1;
  }
  else {
    pcVar20 = argv[1];
    iVar9 = strcmp(pcVar20,"lru");
    if (iVar9 != 0) {
      iVar10 = strcmp(pcVar20,"scalable");
      if (iVar10 != 0) {
        pcVar20 = "Cache type must be either \"lru\" or \"scalable\"\n";
        lVar15 = 0x2e;
        goto LAB_00107b3e;
      }
    }
    cacheType = iVar9 != 0;
    local_90 = (char **)((ulong)local_90._4_4_ << 0x20);
    ptVar2 = (type_info_t *)(local_e8 + 4);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[2];
    _Stack_e0._M_pi = p_Var3;
    local_d8 = ptVar2;
    sVar11 = strlen((char *)p_Var3);
    local_d8 = (type_info_t *)((long)&p_Var3->_vptr__Sp_counted_base + sVar11);
    local_b8.start = (char *)p_Var3;
    local_b8.finish = (char *)local_d8;
    bVar8 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_b8,(int *)&local_90);
    if (!bVar8) {
      local_e8 = (undefined1  [8])&PTR__bad_cast_0010ec78;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&char*::typeinfo;
      local_d8 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_e8);
    }
    local_98 = (ulong)local_90 & 0xffffffff;
    local_90 = (char **)((ulong)local_90 & 0xffffffff00000000);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[3];
    _Stack_e0._M_pi = p_Var3;
    local_d8 = ptVar2;
    sVar11 = strlen((char *)p_Var3);
    local_d8 = (type_info_t *)((long)&p_Var3->_vptr__Sp_counted_base + sVar11);
    local_b8.start = (char *)p_Var3;
    local_b8.finish = (char *)local_d8;
    bVar8 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_b8,(int *)&local_90);
    if (!bVar8) {
      local_e8 = (undefined1  [8])&PTR__bad_cast_0010ec78;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&char*::typeinfo;
      local_d8 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_e8);
    }
    maxSize = (size_t)(int)(type_conflict)local_90;
    local_90 = (char **)((ulong)local_90 & 0xffffffff00000000);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[4];
    _Stack_e0._M_pi = p_Var3;
    local_d8 = ptVar2;
    sVar11 = strlen((char *)p_Var3);
    local_d8 = (type_info_t *)((long)&p_Var3->_vptr__Sp_counted_base + sVar11);
    local_b8.start = (char *)p_Var3;
    local_b8.finish = (char *)local_d8;
    bVar8 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>(&local_b8,(int *)&local_90);
    ppcVar7 = local_90;
    if (!bVar8) {
      local_e8 = (undefined1  [8])&PTR__bad_cast_0010ec78;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&char*::typeinfo;
      local_d8 = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_e8);
    }
    tVar6 = (type_conflict)local_90;
    local_c0._0_4_ = 0;
    uVar16 = local_c0._0_4_;
    local_c0._0_4_ = 0;
    if (argc != 5) {
      local_90 = (char **)((ulong)local_90 & 0xffffffff00000000);
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[5];
      _Stack_e0._M_pi = p_Var3;
      local_d8 = ptVar2;
      sVar11 = strlen((char *)p_Var3);
      local_d8 = (type_info_t *)((long)&p_Var3->_vptr__Sp_counted_base + sVar11);
      local_b8.start = (char *)p_Var3;
      local_b8.finish = (char *)local_d8;
      bVar8 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
              shr_signed<int>(&local_b8,(int *)&local_90);
      if (!bVar8) {
        local_e8 = (undefined1  [8])&PTR__bad_cast_0010ec78;
        _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&char*::typeinfo;
        local_d8 = (type_info_t *)&int::typeinfo;
        boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)local_e8);
      }
      local_c0._0_4_ = (type_conflict)local_90;
      uVar16 = local_c0._0_4_;
    }
    local_c0._0_4_ = uVar16;
    this = (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
            *)operator_new(0x2b8);
    tstarling::
    ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
    ::ThreadSafeLRUCache(this,maxSize);
    std::
    __uniq_ptr_impl<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::reset((__uniq_ptr_impl<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
             *)&aecm,this);
    this_00 = (ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
               *)operator_new(0x28);
    local_50 = maxSize;
    tstarling::
    ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
    ::ThreadSafeScalableCache(this_00,maxSize,0);
    std::
    __uniq_ptr_impl<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::reset((__uniq_ptr_impl<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
             *)&secm,this_00);
    if (0 < (int)tVar6) {
      pcVar20 = (char *)((long)&local_d8 + 7);
      tVar21 = 0;
      do {
        local_90 = local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,'d');
        local_68 = (char *)0x0;
        local_60 = 0;
        local_d0 = local_e8 + 2;
        local_48.m_czero = '0';
        local_48.m_zero = 0x30;
        local_c8 = pcVar20;
        local_70 = &local_60;
        local_48.m_value = tVar21;
        local_48.m_finish = pcVar20;
        local_d0 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                   convert(&local_48);
        local_c8 = pcVar20;
        std::__cxx11::string::replace((ulong)&local_70,0,local_68,(ulong)local_d0);
        pcVar19 = (char *)0xf;
        if (local_90 != local_80) {
          pcVar19 = local_80[0];
        }
        if (pcVar19 < local_68 + local_88) {
          pcVar19 = (char *)0xf;
          if (local_70 != &local_60) {
            pcVar19 = (char *)CONCAT71(uStack_5f,local_60);
          }
          if (pcVar19 < local_68 + local_88) goto LAB_001078b4;
          plVar12 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_001078b4:
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
        }
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar12 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar12 == p_Var3) {
          local_a8._vptr__Sp_counted_base = p_Var3->_vptr__Sp_counted_base;
          local_a8._8_8_ = plVar12[3];
          local_b8.start = (char *)&local_a8;
        }
        else {
          local_a8._vptr__Sp_counted_base = p_Var3->_vptr__Sp_counted_base;
          local_b8.start = (char *)*plVar12;
        }
        local_b8.finish = (char *)plVar12[1];
        *plVar12 = (long)p_Var3;
        plVar12[1] = 0;
        *(undefined1 *)&p_Var3->_vptr__Sp_counted_base = 0;
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        tstarling::ThreadSafeStringKey::ThreadSafeStringKey
                  ((ThreadSafeStringKey *)local_e8,local_b8.start,(size_t)local_b8.finish);
        std::vector<tstarling::ThreadSafeStringKey,_std::allocator<tstarling::ThreadSafeStringKey>_>
        ::emplace_back<tstarling::ThreadSafeStringKey>(&strings,(ThreadSafeStringKey *)local_e8);
        if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.start != &local_a8) {
          operator_delete(local_b8.start);
        }
        tVar21 = tVar21 + 1;
      } while (tVar6 != tVar21);
    }
    uVar17 = local_98;
    iVar9 = (int)local_98;
    local_e8 = (undefined1  [8])0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8 = (type_info_t *)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_e8,(long)iVar9);
    lVar15 = std::chrono::_V2::steady_clock::now();
    if (0 < iVar9) {
      uVar17 = uVar17 & 0xffffffff;
      do {
        std::thread::thread<void(&)(),,void>((thread *)&local_b8,threadMain);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_e8,(thread *)&local_b8
                  );
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.start !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::terminate();
        }
        uVar16 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar16;
      } while (uVar16 != 0);
    }
    if (local_c0._0_4_ == 0) {
      _Var22._M_i = 0;
      _Var23._M_i = 0;
      do {
        local_b8.start = (char *)0x1;
        local_b8.finish = (char *)0x0;
        do {
          iVar9 = nanosleep((timespec *)&local_b8,(timespec *)&local_b8);
          if (iVar9 != -1) break;
          piVar13 = __errno_location();
        } while (*piVar13 == 4);
        aVar5.super___atomic_base<long>._M_i = globalTotalCount.super___atomic_base<long>._M_i;
        aVar4.super___atomic_base<long>._M_i = globalHitCount.super___atomic_base<long>._M_i;
        printf("rate = %.5g kreq/s, hit ratio = %.3g%%\n",
               SUB84((double)((long)globalTotalCount.super___atomic_base<long>._M_i - _Var23._M_i) /
                     1000.0,0),
               ((double)((long)globalHitCount.super___atomic_base<long>._M_i - _Var22._M_i) /
               (double)((long)globalTotalCount.super___atomic_base<long>._M_i - _Var23._M_i)) *
               100.0);
        _Var22 = aVar4.super___atomic_base<long>._M_i;
        _Var23 = aVar5.super___atomic_base<long>._M_i;
      } while( true );
    }
    if (0 < (int)local_c0._0_4_) {
      local_b8.start = (char *)(ulong)local_c0._0_4_;
      local_b8.finish = (char *)0x0;
      do {
        iVar10 = nanosleep((timespec *)&local_b8,(timespec *)&local_b8);
        if (iVar10 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
    }
    aVar5.super___atomic_base<long>._M_i = globalTotalCount.super___atomic_base<long>._M_i;
    aVar4.super___atomic_base<long>._M_i = globalHitCount.super___atomic_base<long>._M_i;
    lVar14 = std::chrono::_V2::steady_clock::now();
    stop = true;
    if (0 < iVar9) {
      lVar1 = local_98 * 8;
      lVar18 = 0;
      do {
        std::thread::join();
        lVar18 = lVar18 + 8;
      } while (lVar1 - lVar18 != 0);
    }
    local_c0 = (double)(lVar14 - lVar15) / 1000000000.0;
    puts("type\tthreads\tcache\tdemand\tduration\trate\tratio");
    pcVar20 = "lru";
    if (cacheType != '\0') {
      pcVar20 = "scal";
    }
    printf("%s\t%d\t%d\t%d\t%g\t%g\t%g%%\n",SUB84(local_c0,0),
           ((double)(long)aVar5.super___atomic_base<long>._M_i / 1000.0) / local_c0,
           ((double)(long)aVar4.super___atomic_base<long>._M_i /
           (double)(long)aVar5.super___atomic_base<long>._M_i) * 100.0,pcVar20,local_98,local_50,
           (ulong)ppcVar7 & 0xffffffff);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_e8);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int main(int argc, char ** argv) {
  using std::chrono::steady_clock;
  using std::chrono::seconds;
  using std::chrono::duration_cast;
  using std::chrono::duration;

  if (argc < 5) {
    std::cerr << "Usage: " << argv[0] << " <lru|scalable> <threads> <cache-size> <demand-size> [<duration>]\n";
    return 1;
  }

  if (0 == strcmp(argv[1], "lru")) {
    cacheType = LRU;
  } else if (0 == strcmp(argv[1], "scalable")) {
    cacheType = SCALABLE;
  } else {
    std::cerr << "Cache type must be either \"lru\" or \"scalable\"\n";
    return 1;
  }

  int numThreads = boost::lexical_cast<int>(argv[2]);
  int cacheSize = boost::lexical_cast<int>(argv[3]);
  int demandSize = boost::lexical_cast<int>(argv[4]);
  int durationLimit = 0;

  if (argc > 5) {
    durationLimit = boost::lexical_cast<int>(argv[5]);
  }

  aecm = std::unique_ptr<AtomicCache>(new AtomicCache(cacheSize));
  secm = std::unique_ptr<ScalableCache>(new ScalableCache(cacheSize));
  for (int i = 0; i < demandSize; i++) {
    std::string s = std::string(100, 'x') + boost::lexical_cast<std::string>(i);
    strings.push_back(String(s.data(), s.size()));
  }

  std::vector<std::thread> threads;
  threads.reserve(numThreads);
  auto startTime = steady_clock::now();
  auto oneSecond = seconds(1);

  for (int i = 0; i < numThreads; i++) {
    threads.push_back(std::thread(threadMain));
  }
  if (durationLimit == 0) {
    long prevTotalCount = 0, prevHitCount = 0;
    for (;;) {
      std::this_thread::sleep_for(oneSecond);
      long totalCount = globalTotalCount.load();
      long hitCount = globalHitCount.load();
      printf("rate = %.5g kreq/s, hit ratio = %.3g%%\n",
          (totalCount - prevTotalCount) / 1000.,
          (double)(hitCount - prevHitCount) / (totalCount - prevTotalCount) * 100);

      prevTotalCount = totalCount;
      prevHitCount = hitCount;
    }
  } else {
    std::this_thread::sleep_for(oneSecond * durationLimit);
    long totalCount = globalTotalCount.load();
    long hitCount = globalHitCount.load();
    auto totalTime = duration_cast<duration<double>>(
        steady_clock::now() - startTime);
    stop = true;
    for (int i = 0; i < numThreads; i++) {
      threads[i].join();
    }
    printf("type\tthreads\tcache\tdemand\tduration\trate\tratio\n");
    printf("%s\t%d\t%d\t%d\t%g\t%g\t%g%%\n",
        cacheType == LRU ? "lru" : "scal",
        numThreads,
        cacheSize,
        demandSize,
        totalTime.count(),
        totalCount / 1000. / totalTime.count(),
        (double)hitCount / totalCount * 100);
  }
  return 0;
}